

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O2

void Aig_ManTransferRepr(Aig_Man_t *pNew,Aig_Man_t *pOld)

{
  Aig_Obj_t **ppAVar1;
  Aig_Obj_t *pNode;
  Aig_Obj_t *pAVar2;
  int iVar3;
  
  if (pNew->pReprs != (Aig_Obj_t **)0x0) {
    iVar3 = pNew->vObjs->nSize;
    if (pNew->nReprsAlloc < iVar3) {
      ppAVar1 = (Aig_Obj_t **)realloc(pNew->pReprs,(long)iVar3 << 4);
      pNew->pReprs = ppAVar1;
      memset(ppAVar1 + pNew->nReprsAlloc,0,((long)(iVar3 * 2) - (long)pNew->nReprsAlloc) * 8);
      pNew->nReprsAlloc = iVar3 * 2;
    }
    for (iVar3 = 0; iVar3 < pOld->vObjs->nSize; iVar3 = iVar3 + 1) {
      pNode = (Aig_Obj_t *)Vec_PtrEntry(pOld->vObjs,iVar3);
      if (pNode != (Aig_Obj_t *)0x0) {
        pAVar2 = Aig_ObjFindRepr(pOld,pNode);
        if (pAVar2 != (Aig_Obj_t *)0x0) {
          Aig_ObjSetRepr_(pNew,(Aig_Obj_t *)((ulong)(pAVar2->field_5).pData & 0xfffffffffffffffe),
                          (Aig_Obj_t *)((ulong)(pNode->field_5).pData & 0xfffffffffffffffe));
        }
      }
    }
    return;
  }
  __assert_fail("pNew->pReprs != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                ,0xd7,"void Aig_ManTransferRepr(Aig_Man_t *, Aig_Man_t *)");
}

Assistant:

void Aig_ManTransferRepr( Aig_Man_t * pNew, Aig_Man_t * pOld )
{
    Aig_Obj_t * pObj, * pRepr;
    int k;
    assert( pNew->pReprs != NULL );
    // extend storage to fix pNew
    if ( pNew->nReprsAlloc < Aig_ManObjNumMax(pNew) )
    {
        int nReprsAllocNew = 2 * Aig_ManObjNumMax(pNew);
        pNew->pReprs = ABC_REALLOC( Aig_Obj_t *, pNew->pReprs, nReprsAllocNew );
        memset( pNew->pReprs + pNew->nReprsAlloc, 0, sizeof(Aig_Obj_t *) * (nReprsAllocNew-pNew->nReprsAlloc) );
        pNew->nReprsAlloc = nReprsAllocNew;
    }
    // go through the nodes which have representatives
    Aig_ManForEachObj( pOld, pObj, k )
        if ( (pRepr = Aig_ObjFindRepr(pOld, pObj)) )
            Aig_ObjSetRepr_( pNew, Aig_Regular((Aig_Obj_t *)pRepr->pData), Aig_Regular((Aig_Obj_t *)pObj->pData) ); 
}